

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O2

ssize_t anon_unknown.dwarf_16ac3::write(int __fd,void *__buf,size_t __n)

{
  int *in_RAX;
  undefined4 in_register_0000003c;
  void *__buf_00;
  size_t __n_00;
  
  __buf_00 = *(void **)CONCAT44(in_register_0000003c,__fd);
  __n_00 = ((long *)CONCAT44(in_register_0000003c,__fd))[1] - (long)__buf_00;
  do {
    while( true ) {
      if (__n_00 == 0) {
        return (ssize_t)in_RAX;
      }
      in_RAX = (int *)::write((int)__buf,__buf_00,__n_00);
      if ((long)in_RAX < 0) break;
      __buf_00 = (void *)((long)__buf_00 + (long)in_RAX);
      __n_00 = __n_00 - (long)in_RAX;
    }
    in_RAX = __errno_location();
  } while (*in_RAX == 0xb);
  fwrite("Writing to file failed\n",0x17,1,_stderr);
  exit(-1);
}

Assistant:

void write(dtc::byte_buffer &buffer, int fd)
{
	size_t size = buffer.size();
	uint8_t *data = buffer.data();
	while (size > 0)
	{
		ssize_t r = ::write(fd, data, size);
		if (r >= 0)
		{
			data += r;
			size -= r;
		}
		else if (errno != EAGAIN)
		{
			fprintf(stderr, "Writing to file failed\n");
			exit(-1);
		}
	}
}